

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

void Sbm_AddSorter(sat_solver *p,int *pVars,int i,int k,int *pnVars)

{
  int iVarA;
  int iVarB;
  int v;
  int fVerbose;
  int iVar2;
  int iVar1;
  int *pnVars_local;
  int k_local;
  int i_local;
  int *pVars_local;
  sat_solver *p_local;
  
  iVarA = *pnVars;
  *pnVars = iVarA + 1;
  iVarB = *pnVars;
  *pnVars = iVarB + 1;
  sat_solver_add_half_sorter(p,iVarA,iVarB,pVars[i],pVars[k]);
  pVars[i] = iVarA;
  pVars[k] = iVarB;
  return;
}

Assistant:

static inline void Sbm_AddSorter( sat_solver * p, int * pVars, int i, int k, int * pnVars )
{
    int iVar1 = (*pnVars)++;
    int iVar2 = (*pnVars)++;
    int fVerbose = 0;
    if ( fVerbose )
    {
        int v;
        for ( v = 0; v < i; v++ )
            printf( " " );
        printf( "<" );
        for ( v = i+1; v < k; v++ )
            printf( "-" );
        printf( ">" );
        for ( v = k+1; v < 8; v++ )
            printf( " " );
        printf( "    " );
        printf( "[%3d :%3d ] -> [%3d :%3d ]\n", pVars[i], pVars[k], iVar1, iVar2 );
    }
//    sat_solver_add_and1( p, iVar1, pVars[i], pVars[k], 1, 1, 1 );
//    sat_solver_add_and2( p, iVar2, pVars[i], pVars[k], 0, 0, 0 );
    sat_solver_add_half_sorter( p, iVar1, iVar2, pVars[i], pVars[k] );
    pVars[i] = iVar1;
    pVars[k] = iVar2;
}